

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O2

wchar_t read_decryption_header(archive_read *a)

{
  ushort uVar1;
  uint uVar2;
  void *pvVar3;
  int error_number;
  uint uVar4;
  uchar *p;
  ushort *puVar5;
  void *__src;
  void *__dest;
  int *piVar6;
  char *pcVar7;
  
  pvVar3 = a->format->data;
  puVar5 = (ushort *)__archive_read_ahead(a,2,(ssize_t *)0x0);
  if (puVar5 == (ushort *)0x0) {
LAB_00160d06:
    pcVar7 = "Truncated ZIP file data";
  }
  else {
    uVar2 = *(uint *)((long)pvVar3 + 0x198);
    *(uint *)((long)pvVar3 + 0x198) = (uint)*puVar5;
    __archive_read_consume(a,2);
    uVar4 = *(uint *)((long)pvVar3 + 0x198);
    if (uVar2 < uVar4) {
      free(*(void **)((long)pvVar3 + 0x1b8));
      *(undefined8 *)((long)pvVar3 + 0x1b8) = 0;
      uVar4 = *(uint *)((long)pvVar3 + 0x198);
    }
    __src = __archive_read_ahead(a,(ulong)uVar4,(ssize_t *)0x0);
    if (__src == (void *)0x0) goto LAB_00160d06;
    __dest = *(void **)((long)pvVar3 + 0x1b8);
    uVar2 = *(uint *)((long)pvVar3 + 0x198);
    if (__dest == (void *)0x0) {
      __dest = malloc((ulong)uVar2);
      *(void **)((long)pvVar3 + 0x1b8) = __dest;
      if (__dest == (void *)0x0) {
        pcVar7 = "No memory for ZIP decryption";
        error_number = 0xc;
        goto LAB_00160d0f;
      }
    }
    memcpy(__dest,__src,(ulong)uVar2);
    __archive_read_consume(a,(ulong)*(uint *)((long)pvVar3 + 0x198));
    piVar6 = (int *)__archive_read_ahead(a,0xe,(ssize_t *)0x0);
    if (piVar6 == (int *)0x0) goto LAB_00160d06;
    if (0xfffc000e < *piVar6 - 0x40001U) {
      if ((short)piVar6[1] == 3) {
        uVar1 = *(ushort *)((long)piVar6 + 6);
        *(uint *)((long)pvVar3 + 0x19c) = (uint)uVar1;
        if ((((uVar1 - 0x6601 < 0x10) && ((0xe107U >> (uVar1 - 0x6601 & 0x1f) & 1) != 0)) ||
            ((uVar1 - 0x6702 < 0x20 && ((0xc0000001U >> (uVar1 - 0x6702 & 0x1f) & 1) != 0)))) ||
           (uVar1 == 0x6801)) {
          *(uint *)((long)pvVar3 + 0x1a0) = (uint)*(ushort *)(piVar6 + 2);
          *(uint *)((long)pvVar3 + 0x1a4) = (uint)*(ushort *)((long)piVar6 + 10);
          pcVar7 = "Unknown encryption flag: %u";
        }
        else {
          pcVar7 = "Unknown encryption algorithm: %u";
        }
      }
      else {
        pcVar7 = "Unsupported encryption format version: %u";
      }
      archive_set_error(&a->archive,0x54,pcVar7);
      return L'\xffffffe7';
    }
    pcVar7 = "Corrupted ZIP file data";
  }
  error_number = 0x54;
LAB_00160d0f:
  archive_set_error(&a->archive,error_number,pcVar7);
  return L'\xffffffe2';
}

Assistant:

static int
read_decryption_header(struct archive_read *a)
{
	struct zip *zip = (struct zip *)(a->format->data);
	const char *p;
	unsigned int remaining_size;
	unsigned int ts;

	/*
	 * Read an initialization vector data field.
	 */
	p = __archive_read_ahead(a, 2, NULL);
	if (p == NULL)
		goto truncated;
	ts = zip->iv_size;
	zip->iv_size = archive_le16dec(p);
	__archive_read_consume(a, 2);
	if (ts < zip->iv_size) {
		free(zip->iv);
		zip->iv = NULL;
	}
	p = __archive_read_ahead(a, zip->iv_size, NULL);
	if (p == NULL)
		goto truncated;
	if (zip->iv == NULL) {
		zip->iv = malloc(zip->iv_size);
		if (zip->iv == NULL)
			goto nomem;
	}
	memcpy(zip->iv, p, zip->iv_size);
	__archive_read_consume(a, zip->iv_size);

	/*
	 * Read a size of remaining decryption header field.
	 */
	p = __archive_read_ahead(a, 14, NULL);
	if (p == NULL)
		goto truncated;
	remaining_size = archive_le32dec(p);
	if (remaining_size < 16 || remaining_size > (1 << 18))
		goto corrupted;

	/* Check if format version is supported. */
	if (archive_le16dec(p+4) != 3) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unsupported encryption format version: %u",
		    archive_le16dec(p+4));
		return (ARCHIVE_FAILED);
	}

	/*
	 * Read an encryption algorithm field.
	 */
	zip->alg_id = archive_le16dec(p+6);
	switch (zip->alg_id) {
	case 0x6601:/* DES */
	case 0x6602:/* RC2 */
	case 0x6603:/* 3DES 168 */
	case 0x6609:/* 3DES 112 */
	case 0x660E:/* AES 128 */
	case 0x660F:/* AES 192 */
	case 0x6610:/* AES 256 */
	case 0x6702:/* RC2 (version >= 5.2) */
	case 0x6720:/* Blowfish */
	case 0x6721:/* Twofish */
	case 0x6801:/* RC4 */
		/* Suuported encryption algorithm. */
		break;
	default:
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unknown encryption algorithm: %u", zip->alg_id);
		return (ARCHIVE_FAILED);
	}

	/*
	 * Read a bit length field.
	 */
	zip->bit_len = archive_le16dec(p+8);

	/*
	 * Read a flags field.
	 */
	zip->flags = archive_le16dec(p+10);
	switch (zip->flags & 0xf000) {
	case 0x0001: /* Password is required to decrypt. */
	case 0x0002: /* Certificates only. */
	case 0x0003: /* Password or certificate required to decrypt. */
		break;
	default:
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unknown encryption flag: %u", zip->flags);
		return (ARCHIVE_FAILED);
	}
	if ((zip->flags & 0xf000) == 0 ||
	    (zip->flags & 0xf000) == 0x4000) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unknown encryption flag: %u", zip->flags);
		return (ARCHIVE_FAILED);
	}

	/*
	 * Read an encrypted random data field.
	 */
	ts = zip->erd_size;
	zip->erd_size = archive_le16dec(p+12);
	__archive_read_consume(a, 14);
	if ((zip->erd_size & 0xf) != 0 ||
	    (zip->erd_size + 16) > remaining_size ||
	    (zip->erd_size + 16) < zip->erd_size)
		goto corrupted;

	if (ts < zip->erd_size) {
		free(zip->erd);
		zip->erd = NULL;
	}
	p = __archive_read_ahead(a, zip->erd_size, NULL);
	if (p == NULL)
		goto truncated;
	if (zip->erd == NULL) {
		zip->erd = malloc(zip->erd_size);
		if (zip->erd == NULL)
			goto nomem;
	}
	memcpy(zip->erd, p, zip->erd_size);
	__archive_read_consume(a, zip->erd_size);

	/*
	 * Read a reserved data field.
	 */
	p = __archive_read_ahead(a, 4, NULL);
	if (p == NULL)
		goto truncated;
	/* Reserved data size should be zero. */
	if (archive_le32dec(p) != 0)
		goto corrupted;
	__archive_read_consume(a, 4);

	/*
	 * Read a password validation data field.
	 */
	p = __archive_read_ahead(a, 2, NULL);
	if (p == NULL)
		goto truncated;
	ts = zip->v_size;
	zip->v_size = archive_le16dec(p);
	__archive_read_consume(a, 2);
	if ((zip->v_size & 0x0f) != 0 ||
	    (zip->erd_size + zip->v_size + 16) > remaining_size ||
	    (zip->erd_size + zip->v_size + 16) < (zip->erd_size + zip->v_size))
		goto corrupted;
	if (ts < zip->v_size) {
		free(zip->v_data);
		zip->v_data = NULL;
	}
	p = __archive_read_ahead(a, zip->v_size, NULL);
	if (p == NULL)
		goto truncated;
	if (zip->v_data == NULL) {
		zip->v_data = malloc(zip->v_size);
		if (zip->v_data == NULL)
			goto nomem;
	}
	memcpy(zip->v_data, p, zip->v_size);
	__archive_read_consume(a, zip->v_size);

	p = __archive_read_ahead(a, 4, NULL);
	if (p == NULL)
		goto truncated;
	zip->v_crc32 = archive_le32dec(p);
	__archive_read_consume(a, 4);

	/*return (ARCHIVE_OK);
	 * This is not fully implemnted yet.*/
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Encrypted file is unsupported");
	return (ARCHIVE_FAILED);
truncated:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Truncated ZIP file data");
	return (ARCHIVE_FATAL);
corrupted:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Corrupted ZIP file data");
	return (ARCHIVE_FATAL);
nomem:
	archive_set_error(&a->archive, ENOMEM,
	    "No memory for ZIP decryption");
	return (ARCHIVE_FATAL);
}